

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void ParseXMLElement(TidyDocImpl *doc,Node *element,GetTokenMode mode)

{
  Lexer *pLVar1;
  Bool BVar2;
  int iVar3;
  Node *pNVar4;
  Node *node;
  Lexer *lexer;
  GetTokenMode mode_local;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  BVar2 = prvTidyXMLPreserveWhiteSpace(doc,element);
  lexer._4_4_ = mode;
  if (BVar2 != no) {
    lexer._4_4_ = Preformatted;
  }
  do {
    pNVar4 = prvTidyGetToken(doc,lexer._4_4_);
    if (pNVar4 == (Node *)0x0) {
LAB_00137305:
      pNVar4 = element->content;
      BVar2 = prvTidynodeIsText(pNVar4);
      if (((BVar2 != no) && (lexer._4_4_ != Preformatted)) &&
         ((pLVar1->lexbuf[pNVar4->start] == ' ' &&
          (pNVar4->start = pNVar4->start + 1, pNVar4->end <= pNVar4->start)))) {
        prvTidyDiscardElement(doc,pNVar4);
      }
      pNVar4 = element->last;
      BVar2 = prvTidynodeIsText(pNVar4);
      if (((BVar2 != no) && (lexer._4_4_ != Preformatted)) &&
         ((pLVar1->lexbuf[pNVar4->end - 1] == ' ' &&
          (pNVar4->end = pNVar4->end - 1, pNVar4->end <= pNVar4->start)))) {
        prvTidyDiscardElement(doc,pNVar4);
      }
      return;
    }
    if ((((pNVar4->type == EndTag) && (pNVar4->element != (tmbstr)0x0)) &&
        (element->element != (tmbstr)0x0)) &&
       (iVar3 = prvTidytmbstrcmp(pNVar4->element,element->element), iVar3 == 0)) {
      prvTidyFreeNode(doc,pNVar4);
      element->closed = yes;
      goto LAB_00137305;
    }
    if (pNVar4->type == EndTag) {
      if (element == (Node *)0x0) {
        prvTidyReportFatal(doc,(Node *)0x0,pNVar4,0xd5);
      }
      else {
        prvTidyReportFatal(doc,element,pNVar4,0xf7);
      }
      prvTidyFreeNode(doc,pNVar4);
    }
    else {
      if (pNVar4->type == StartTag) {
        ParseXMLElement(doc,pNVar4,lexer._4_4_);
      }
      prvTidyInsertNodeAtEnd(element,pNVar4);
    }
  } while( true );
}

Assistant:

static void ParseXMLElement(TidyDocImpl* doc, Node *element, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    Node *node;

    /* if node is pre or has xml:space="preserve" then do so */

    if ( TY_(XMLPreserveWhiteSpace)(doc, element) )
        mode = Preformatted;

    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        if (node->type == EndTag &&
           node->element && element->element &&
           TY_(tmbstrcmp)(node->element, element->element) == 0)
        {
            TY_(FreeNode)( doc, node);
            element->closed = yes;
            break;
        }

        /* discard unexpected end tags */
        if (node->type == EndTag)
        {
            if (element)
                TY_(ReportFatal)(doc, element, node, UNEXPECTED_ENDTAG_IN);
            else
                TY_(ReportFatal)(doc, element, node, UNEXPECTED_ENDTAG);

            TY_(FreeNode)( doc, node);
            continue;
        }

        /* parse content on seeing start tag */
        if (node->type == StartTag)
            ParseXMLElement( doc, node, mode );

        TY_(InsertNodeAtEnd)(element, node);
    }

    /*
     if first child is text then trim initial space and
     delete text node if it is empty.
    */

    node = element->content;

    if (TY_(nodeIsText)(node) && mode != Preformatted)
    {
        if ( lexer->lexbuf[node->start] == ' ' )
        {
            node->start++;

            if (node->start >= node->end)
                TY_(DiscardElement)( doc, node );
        }
    }

    /*
     if last child is text then trim final space and
     delete the text node if it is empty
    */

    node = element->last;

    if (TY_(nodeIsText)(node) && mode != Preformatted)
    {
        if ( lexer->lexbuf[node->end - 1] == ' ' )
        {
            node->end--;

            if (node->start >= node->end)
                TY_(DiscardElement)( doc, node );
        }
    }
}